

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O3

size_t sshproxy_banner(Seat *seat,void *data,size_t len)

{
  size_t sVar1;
  
  if (seat[-0x411].vt != (SeatVtable *)0x0) {
    sVar1 = (**(code **)((seat[-0x411].vt)->output + 0x18))();
    return sVar1;
  }
  return 0;
}

Assistant:

static size_t sshproxy_banner(Seat *seat, const void *data, size_t len)
{
    SshProxy *sp = container_of(seat, SshProxy, seat);
    if (sp->clientseat) {
        /*
         * If we have access to the outer Seat, pass the SSH login
         * banner on to it.
         */
        return seat_banner(wrap(sp->clientseat), data, len);
    } else {
        return 0;
    }
}